

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx512::ConeCurveMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Scene *pSVar14;
  Geometry *pGVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  ulong uVar72;
  ulong uVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  ulong uVar81;
  undefined1 auVar82 [8];
  bool bVar83;
  bool bVar84;
  byte bVar85;
  byte bVar86;
  ulong uVar87;
  ulong uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar90 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  undefined1 in_ZMM21 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  uint local_520 [4];
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int iStack_33c;
  int iStack_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int iStack_328;
  int iStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  RTCHitN local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar150 [64];
  
  pSVar14 = context->scene;
  pGVar15 = (pSVar14->geometries).items[line->sharedGeomID].ptr;
  uVar6 = (line->v0).field_0.i[0];
  lVar16 = *(long *)&pGVar15[1].time_range.upper;
  p_Var17 = pGVar15[1].intersectionFilterN;
  uVar7 = (line->v0).field_0.i[1];
  uVar8 = (line->v0).field_0.i[2];
  uVar9 = (line->v0).field_0.i[3];
  uVar10 = (line->v0).field_0.i[4];
  auVar100._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar10 * (long)p_Var17);
  auVar100._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar6 * (long)p_Var17);
  uVar11 = (line->v0).field_0.i[5];
  auVar123._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar11 * (long)p_Var17);
  auVar123._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar7 * (long)p_Var17);
  uVar12 = (line->v0).field_0.i[6];
  auVar105._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar12 * (long)p_Var17);
  auVar105._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar8 * (long)p_Var17);
  uVar13 = (line->v0).field_0.i[7];
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar13 * (long)p_Var17);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar16 + (ulong)uVar9 * (long)p_Var17);
  auVar89 = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar10 + 1) * (long)p_Var17);
  auVar111._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar16 + (ulong)(uVar6 + 1) * (long)p_Var17);
  auVar111._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar11 + 1) * (long)p_Var17);
  auVar116._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar16 + (ulong)(uVar7 + 1) * (long)p_Var17);
  auVar116._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar12 + 1) * (long)p_Var17);
  auVar112._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar16 + (ulong)(uVar8 + 1) * (long)p_Var17);
  auVar112._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  auVar89 = *(undefined1 (*) [16])(lVar16 + (ulong)(uVar13 + 1) * (long)p_Var17);
  auVar91._0_16_ =
       ZEXT116(0) * auVar89 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar16 + (ulong)(uVar9 + 1) * (long)p_Var17);
  auVar91._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar89;
  local_220 = vpbroadcastd_avx512vl();
  auVar97 = vunpcklps_avx(auVar100,auVar105);
  auVar95 = vunpckhps_avx(auVar100,auVar105);
  auVar100 = vunpcklps_avx(auVar123,auVar101);
  auVar96 = vunpckhps_avx(auVar123,auVar101);
  auVar105 = vunpcklps_avx(auVar97,auVar100);
  auVar100 = vunpckhps_avx(auVar97,auVar100);
  auVar101 = vunpcklps_avx(auVar95,auVar96);
  auVar123 = vunpckhps_avx(auVar95,auVar96);
  auVar97 = vpunpckldq_avx2(auVar111,auVar112);
  auVar95 = vpunpckhdq_avx2(auVar111,auVar112);
  auVar111 = vpunpckldq_avx2(auVar116,auVar91);
  auVar96 = vpunpckhdq_avx2(auVar116,auVar91);
  auVar116 = vpunpckldq_avx2(auVar97,auVar111);
  auVar111 = vpunpckhdq_avx2(auVar97,auVar111);
  auVar112 = vpunpckldq_avx2(auVar95,auVar96);
  auVar91 = vpunpckhdq_avx512vl(auVar95,auVar96);
  auVar95 = vpcmpeqd_avx2(auVar97,auVar97);
  uVar73 = vpcmpd_avx512vl(auVar95,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar99._4_4_ = fVar1;
  auVar99._0_4_ = fVar1;
  auVar99._8_4_ = fVar1;
  auVar99._12_4_ = fVar1;
  auVar99._16_4_ = fVar1;
  auVar99._20_4_ = fVar1;
  auVar99._24_4_ = fVar1;
  auVar99._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar102._4_4_ = fVar2;
  auVar102._0_4_ = fVar2;
  auVar102._8_4_ = fVar2;
  auVar102._12_4_ = fVar2;
  auVar102._16_4_ = fVar2;
  auVar102._20_4_ = fVar2;
  auVar102._24_4_ = fVar2;
  auVar102._28_4_ = fVar2;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar103._4_4_ = uVar3;
  auVar103._0_4_ = uVar3;
  auVar103._8_4_ = uVar3;
  auVar103._12_4_ = uVar3;
  auVar103._16_4_ = uVar3;
  auVar103._20_4_ = uVar3;
  auVar103._24_4_ = uVar3;
  auVar103._28_4_ = uVar3;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar171 = ZEXT3264(auVar92);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar172 = ZEXT3264(auVar93);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar173 = ZEXT3264(auVar94);
  auVar89 = vmulss_avx512f(auVar94._0_16_,auVar94._0_16_);
  auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar93,auVar93);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar92);
  auVar97._0_4_ = auVar95._0_4_;
  auVar97._4_4_ = auVar97._0_4_;
  auVar97._8_4_ = auVar97._0_4_;
  auVar97._12_4_ = auVar97._0_4_;
  auVar97._16_4_ = auVar97._0_4_;
  auVar97._20_4_ = auVar97._0_4_;
  auVar97._24_4_ = auVar97._0_4_;
  auVar97._28_4_ = auVar97._0_4_;
  auVar96 = vrcp14ps_avx512vl(auVar97);
  auVar90 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = &DAT_3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar95._16_4_ = 0x3f800000;
  auVar95._20_4_ = 0x3f800000;
  auVar95._24_4_ = 0x3f800000;
  auVar95._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar95);
  auVar89 = vfmadd132ps_fma(auVar95,auVar96,auVar96);
  auVar98._0_4_ = auVar105._0_4_ + auVar116._0_4_;
  auVar98._4_4_ = auVar105._4_4_ + auVar116._4_4_;
  auVar98._8_4_ = auVar105._8_4_ + auVar116._8_4_;
  auVar98._12_4_ = auVar105._12_4_ + auVar116._12_4_;
  auVar98._16_4_ = auVar105._16_4_ + auVar116._16_4_;
  auVar98._20_4_ = auVar105._20_4_ + auVar116._20_4_;
  auVar98._24_4_ = auVar105._24_4_ + auVar116._24_4_;
  auVar98._28_4_ = auVar105._28_4_ + auVar116._28_4_;
  auVar104._0_4_ = auVar111._0_4_ + auVar100._0_4_;
  auVar104._4_4_ = auVar111._4_4_ + auVar100._4_4_;
  auVar104._8_4_ = auVar111._8_4_ + auVar100._8_4_;
  auVar104._12_4_ = auVar111._12_4_ + auVar100._12_4_;
  auVar104._16_4_ = auVar111._16_4_ + auVar100._16_4_;
  auVar104._20_4_ = auVar111._20_4_ + auVar100._20_4_;
  auVar104._24_4_ = auVar111._24_4_ + auVar100._24_4_;
  auVar104._28_4_ = auVar111._28_4_ + auVar100._28_4_;
  auVar106._0_4_ = auVar101._0_4_ + auVar112._0_4_;
  auVar106._4_4_ = auVar101._4_4_ + auVar112._4_4_;
  auVar106._8_4_ = auVar101._8_4_ + auVar112._8_4_;
  auVar106._12_4_ = auVar101._12_4_ + auVar112._12_4_;
  auVar106._16_4_ = auVar101._16_4_ + auVar112._16_4_;
  auVar106._20_4_ = auVar101._20_4_ + auVar112._20_4_;
  auVar106._24_4_ = auVar101._24_4_ + auVar112._24_4_;
  auVar106._28_4_ = auVar101._28_4_ + auVar112._28_4_;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar96 = vmulps_avx512vl(auVar98,auVar95);
  auVar97 = vmulps_avx512vl(auVar104,auVar95);
  auVar98 = vmulps_avx512vl(auVar106,auVar95);
  auVar95 = vsubps_avx(auVar96,auVar99);
  auVar96 = vsubps_avx(auVar97,auVar102);
  auVar97 = vsubps_avx(auVar98,auVar103);
  auVar97 = vmulps_avx512vl(auVar97,auVar94);
  auVar96 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar96);
  auVar95 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar95);
  auVar129._0_4_ = auVar95._0_4_ * auVar89._0_4_;
  auVar129._4_4_ = auVar95._4_4_ * auVar89._4_4_;
  auVar129._8_4_ = auVar95._8_4_ * auVar89._8_4_;
  auVar129._12_4_ = auVar95._12_4_ * auVar89._12_4_;
  auVar129._16_4_ = auVar95._16_4_ * 0.0;
  auVar129._20_4_ = auVar95._20_4_ * 0.0;
  auVar129._24_4_ = auVar95._24_4_ * 0.0;
  auVar129._28_4_ = 0;
  auVar95 = vmulps_avx512vl(auVar92,auVar129);
  auVar96 = vmulps_avx512vl(auVar93,auVar129);
  auVar97 = vmulps_avx512vl(auVar94,auVar129);
  auVar151._0_4_ = auVar95._0_4_ + fVar1;
  auVar151._4_4_ = auVar95._4_4_ + fVar1;
  auVar151._8_4_ = auVar95._8_4_ + fVar1;
  auVar151._12_4_ = auVar95._12_4_ + fVar1;
  auVar151._16_4_ = auVar95._16_4_ + fVar1;
  auVar151._20_4_ = auVar95._20_4_ + fVar1;
  auVar151._24_4_ = auVar95._24_4_ + fVar1;
  auVar151._28_4_ = auVar95._28_4_ + fVar1;
  auVar155._0_4_ = fVar2 + auVar96._0_4_;
  auVar155._4_4_ = fVar2 + auVar96._4_4_;
  auVar155._8_4_ = fVar2 + auVar96._8_4_;
  auVar155._12_4_ = fVar2 + auVar96._12_4_;
  auVar155._16_4_ = fVar2 + auVar96._16_4_;
  auVar155._20_4_ = fVar2 + auVar96._20_4_;
  auVar155._24_4_ = fVar2 + auVar96._24_4_;
  auVar155._28_4_ = fVar2 + auVar96._28_4_;
  auVar95 = vaddps_avx512vl(auVar103,auVar97);
  auVar97 = vsubps_avx512vl(auVar116,auVar105);
  auVar176 = ZEXT3264(auVar97);
  auVar98 = vsubps_avx512vl(auVar111,auVar100);
  auVar174 = ZEXT3264(auVar98);
  auVar99 = vsubps_avx512vl(auVar112,auVar101);
  auVar175 = ZEXT3264(auVar99);
  _local_5c0 = vsubps_avx(auVar151,auVar105);
  _local_5e0 = vsubps_avx(auVar155,auVar100);
  auVar100 = vsubps_avx512vl(auVar95,auVar101);
  auVar177 = ZEXT3264(auVar100);
  auVar96 = vmulps_avx512vl(auVar99,auVar99);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar98);
  auVar101 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar97);
  auVar96 = vmulps_avx512vl(auVar99,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,_local_5e0,auVar98);
  auVar102 = vfmadd231ps_avx512vl(auVar96,_local_5c0,auVar97);
  auVar96 = vmulps_avx512vl(auVar99,auVar94);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar98);
  auVar103 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar97);
  auVar104 = vsubps_avx512vl(auVar123,auVar91);
  fVar1 = auVar104._0_4_;
  fVar56 = auVar104._4_4_;
  fVar58 = auVar104._8_4_;
  fVar60 = auVar104._12_4_;
  fVar62 = auVar104._16_4_;
  fVar64 = auVar104._20_4_;
  fVar66 = auVar104._24_4_;
  auVar132._0_4_ = fVar1 * fVar1 + auVar101._0_4_;
  auVar132._4_4_ = fVar56 * fVar56 + auVar101._4_4_;
  auVar132._8_4_ = fVar58 * fVar58 + auVar101._8_4_;
  auVar132._12_4_ = fVar60 * fVar60 + auVar101._12_4_;
  auVar132._16_4_ = fVar62 * fVar62 + auVar101._16_4_;
  auVar132._20_4_ = fVar64 * fVar64 + auVar101._20_4_;
  auVar132._24_4_ = fVar66 * fVar66 + auVar101._24_4_;
  auVar132._28_4_ = auVar105._28_4_ + auVar101._28_4_;
  auVar96 = vmulps_avx512vl(auVar94,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,_local_5e0);
  auVar105 = vfmadd231ps_avx512vl(auVar96,auVar92,_local_5c0);
  auVar96 = vmulps_avx512vl(auVar100,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,_local_5e0,_local_5e0);
  auVar106 = vfmadd231ps_avx512vl(auVar96,_local_5c0,_local_5c0);
  auVar107 = vmulps_avx512vl(auVar101,auVar101);
  auVar178 = ZEXT3264(auVar107);
  auVar108 = vmulps_avx512vl(auVar123,auVar101);
  fVar2 = auVar103._0_4_;
  fVar57 = auVar103._4_4_;
  auVar96._4_4_ = fVar57 * fVar57;
  auVar96._0_4_ = fVar2 * fVar2;
  fVar59 = auVar103._8_4_;
  auVar96._8_4_ = fVar59 * fVar59;
  fVar61 = auVar103._12_4_;
  auVar96._12_4_ = fVar61 * fVar61;
  fVar63 = auVar103._16_4_;
  auVar96._16_4_ = fVar63 * fVar63;
  fVar65 = auVar103._20_4_;
  auVar96._20_4_ = fVar65 * fVar65;
  fVar67 = auVar103._24_4_;
  auVar96._24_4_ = fVar67 * fVar67;
  auVar96._28_4_ = local_5c0._28_4_;
  auVar109 = vmulps_avx512vl(auVar132,auVar96);
  auVar109 = vsubps_avx512vl(auVar107,auVar109);
  auVar105 = vmulps_avx512vl(auVar107,auVar105);
  auVar110 = vmulps_avx512vl(auVar103,auVar102);
  auVar110 = vmulps_avx512vl(auVar132,auVar110);
  auVar105 = vsubps_avx512vl(auVar105,auVar110);
  auVar110 = vmulps_avx512vl(auVar104,auVar103);
  auVar110 = vmulps_avx512vl(auVar108,auVar110);
  auVar105 = vaddps_avx512vl(auVar110,auVar105);
  auVar106 = vmulps_avx512vl(auVar107,auVar106);
  auVar110 = vmulps_avx512vl(auVar102,auVar102);
  auVar110 = vmulps_avx512vl(auVar132,auVar110);
  auVar106 = vsubps_avx512vl(auVar106,auVar110);
  auVar104 = vaddps_avx512vl(auVar104,auVar104);
  auVar104 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vsubps_avx512vl(auVar104,auVar108);
  auVar104 = vmulps_avx512vl(auVar108,auVar104);
  auVar104 = vaddps_avx512vl(auVar106,auVar104);
  auVar106 = vmulps_avx512vl(auVar105,auVar105);
  auVar104 = vmulps_avx512vl(auVar109,auVar104);
  auVar104 = vsubps_avx512vl(auVar106,auVar104);
  uVar81 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar90),5);
  bVar86 = (byte)(uVar73 & uVar81);
  if (bVar86 != 0) {
    auVar116 = vsubps_avx(auVar151,auVar116);
    auVar111 = vsubps_avx512vl(auVar155,auVar111);
    auVar112 = vsubps_avx512vl(auVar95,auVar112);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar95 = vrcp14ps_avx512vl(auVar109);
    auVar136._8_4_ = 0x3f800000;
    auVar136._0_8_ = &DAT_3f8000003f800000;
    auVar136._12_4_ = 0x3f800000;
    auVar136._16_4_ = 0x3f800000;
    auVar136._20_4_ = 0x3f800000;
    auVar136._24_4_ = 0x3f800000;
    auVar136._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_avx512vl(auVar95,auVar109,auVar136);
    auVar89 = vfmadd132ps_fma(auVar106,auVar95,auVar95);
    auVar108._8_4_ = 0x7fffffff;
    auVar108._0_8_ = 0x7fffffff7fffffff;
    auVar108._12_4_ = 0x7fffffff;
    auVar108._16_4_ = 0x7fffffff;
    auVar108._20_4_ = 0x7fffffff;
    auVar108._24_4_ = 0x7fffffff;
    auVar108._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar109,auVar108);
    auVar109._8_4_ = 0x219392ef;
    auVar109._0_8_ = 0x219392ef219392ef;
    auVar109._12_4_ = 0x219392ef;
    auVar109._16_4_ = 0x219392ef;
    auVar109._20_4_ = 0x219392ef;
    auVar109._24_4_ = 0x219392ef;
    auVar109._28_4_ = 0x219392ef;
    uVar87 = vcmpps_avx512vl(auVar106,auVar109,2);
    auVar135._8_4_ = 0x80000000;
    auVar135._0_8_ = 0x8000000080000000;
    auVar135._12_4_ = 0x80000000;
    auVar135._16_4_ = 0x80000000;
    auVar135._20_4_ = 0x80000000;
    auVar135._24_4_ = 0x80000000;
    auVar135._28_4_ = 0x80000000;
    auVar95 = vxorps_avx512vl(auVar105,auVar135);
    auVar95 = vsubps_avx(auVar95,auVar104);
    auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar89));
    auVar146._8_4_ = 0xff800000;
    auVar146._0_8_ = 0xff800000ff800000;
    auVar146._12_4_ = 0xff800000;
    auVar146._16_4_ = 0xff800000;
    auVar146._20_4_ = 0xff800000;
    auVar146._24_4_ = 0xff800000;
    auVar146._28_4_ = 0xff800000;
    bVar83 = (bool)((byte)uVar87 & 1);
    auVar113._0_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._0_4_;
    bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar113._4_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._4_4_;
    bVar83 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar113._8_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._8_4_;
    bVar83 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar113._12_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._12_4_;
    bVar83 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar113._16_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._16_4_;
    bVar83 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar113._20_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._20_4_;
    bVar83 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar113._24_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._24_4_;
    bVar83 = SUB81(uVar87 >> 7,0);
    auVar113._28_4_ = (uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._28_4_;
    auVar95 = vsubps_avx512vl(auVar104,auVar105);
    auVar148._8_4_ = 0x7f800000;
    auVar148._0_8_ = 0x7f8000007f800000;
    auVar148._12_4_ = 0x7f800000;
    auVar148._16_4_ = 0x7f800000;
    auVar148._20_4_ = 0x7f800000;
    auVar148._24_4_ = 0x7f800000;
    auVar148._28_4_ = 0x7f800000;
    bVar83 = (bool)((byte)uVar87 & 1);
    auVar114._0_4_ =
         (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._0_4_ * auVar89._0_4_);
    bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar114._4_4_ =
         (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._4_4_ * auVar89._4_4_);
    bVar83 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar114._8_4_ =
         (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._8_4_ * auVar89._8_4_);
    bVar83 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar114._12_4_ =
         (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._12_4_ * auVar89._12_4_);
    bVar83 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar114._16_4_ = (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._16_4_ * 0.0);
    bVar83 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar114._20_4_ = (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._20_4_ * 0.0);
    bVar83 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar114._24_4_ = (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)(auVar95._24_4_ * 0.0);
    bVar83 = SUB81(uVar87 >> 7,0);
    auVar114._28_4_ = (uint)bVar83 * 0x7f800000 | (uint)!bVar83 * (int)auVar155._28_4_;
    auVar152._0_4_ = fVar2 * (float)local_5c0._0_4_;
    auVar152._4_4_ = fVar57 * (float)local_5c0._4_4_;
    auVar152._8_4_ = fVar59 * fStack_5b8;
    auVar152._12_4_ = fVar61 * fStack_5b4;
    auVar152._16_4_ = fVar63 * fStack_5b0;
    auVar152._20_4_ = fVar65 * fStack_5ac;
    auVar152._24_4_ = fVar67 * fStack_5a8;
    auVar152._28_4_ = 0;
    auVar95 = vmulps_avx512vl(auVar103,_local_5e0);
    auVar105 = vmulps_avx512vl(auVar103,auVar100);
    auVar89 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
    auVar104 = vmulps_avx512vl(auVar92,auVar102);
    auVar104 = vsubps_avx512vl(auVar152,auVar104);
    auVar106 = vmulps_avx512vl(auVar93,auVar102);
    auVar95 = vsubps_avx512vl(auVar95,auVar106);
    auVar106 = vmulps_avx512vl(auVar94,auVar102);
    auVar105 = vsubps_avx512vl(auVar105,auVar106);
    auVar106 = vmulps_avx512vl(auVar103,auVar113);
    auVar153._0_4_ = auVar102._0_4_ + auVar106._0_4_;
    auVar153._4_4_ = auVar102._4_4_ + auVar106._4_4_;
    auVar153._8_4_ = auVar102._8_4_ + auVar106._8_4_;
    auVar153._12_4_ = auVar102._12_4_ + auVar106._12_4_;
    auVar153._16_4_ = auVar102._16_4_ + auVar106._16_4_;
    auVar153._20_4_ = auVar102._20_4_ + auVar106._20_4_;
    auVar153._24_4_ = auVar102._24_4_ + auVar106._24_4_;
    auVar153._28_4_ = auVar102._28_4_ + auVar106._28_4_;
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar105,auVar95,auVar95);
    auVar105 = vmulps_avx512vl(auVar103,auVar114);
    auVar105 = vaddps_avx512vl(auVar102,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar123,auVar123);
    auVar96 = vmulps_avx512vl(auVar104,auVar96);
    uVar87 = vcmpps_avx512vl(auVar95,auVar96,1);
    uVar87 = (bVar86 & ~(byte)line->leftExists) & uVar87;
    auVar95 = vrcp14ps_avx512vl(auVar103);
    auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar103,auVar136);
    auVar95 = vfmadd132ps_avx512vl(auVar96,auVar95,auVar95);
    auVar161 = ZEXT3264(auVar105);
    auVar141._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
    auVar141._8_4_ = -auVar102._8_4_;
    auVar141._12_4_ = -auVar102._12_4_;
    auVar141._16_4_ = -auVar102._16_4_;
    auVar141._20_4_ = -auVar102._20_4_;
    auVar141._24_4_ = -auVar102._24_4_;
    auVar141._28_4_ = -auVar102._28_4_;
    auVar96 = vmulps_avx512vl(auVar95,auVar141);
    bVar83 = (bool)((byte)uVar87 & 1);
    auVar115._0_4_ = (uint)bVar83 * auVar96._0_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar115._4_4_ = (uint)bVar83 * auVar96._4_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar115._8_4_ = (uint)bVar83 * auVar96._8_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar115._12_4_ = (uint)bVar83 * auVar96._12_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar115._16_4_ = (uint)bVar83 * auVar96._16_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar115._20_4_ = (uint)bVar83 * auVar96._20_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar115._24_4_ = (uint)bVar83 * auVar96._24_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = SUB81(uVar87 >> 7,0);
    auVar115._28_4_ = (uint)bVar83 * auVar96._28_4_ | (uint)!bVar83 * 0x7f800000;
    uVar68 = vcmpps_avx512vl(auVar153,auVar101,1);
    uVar69 = vcmpps_avx512vl(auVar153,ZEXT1632(auVar89),6);
    uVar70 = vcmpps_avx512vl(auVar105,auVar101,1);
    uVar71 = vcmpps_avx512vl(auVar105,ZEXT1632(auVar89),6);
    auVar96 = vmulps_avx512vl(auVar99,auVar112);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar98);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar116,auVar97);
    auVar110._4_4_ = fVar57 * auVar116._4_4_;
    auVar110._0_4_ = fVar2 * auVar116._0_4_;
    auVar110._8_4_ = fVar59 * auVar116._8_4_;
    auVar110._12_4_ = fVar61 * auVar116._12_4_;
    auVar110._16_4_ = fVar63 * auVar116._16_4_;
    auVar110._20_4_ = fVar65 * auVar116._20_4_;
    auVar110._24_4_ = fVar67 * auVar116._24_4_;
    auVar110._28_4_ = auVar141._28_4_;
    auVar111 = vmulps_avx512vl(auVar103,auVar111);
    auVar116 = vmulps_avx512vl(auVar103,auVar112);
    auVar102 = vmulps_avx512vl(auVar92,auVar96);
    auVar102 = vsubps_avx512vl(auVar110,auVar102);
    auVar103 = vmulps_avx512vl(auVar93,auVar96);
    auVar111 = vsubps_avx512vl(auVar111,auVar103);
    auVar103 = vmulps_avx512vl(auVar94,auVar96);
    auVar116 = vsubps_avx512vl(auVar116,auVar103);
    auVar78._4_4_ = auVar116._4_4_ * auVar116._4_4_;
    auVar78._0_4_ = auVar116._0_4_ * auVar116._0_4_;
    auVar78._8_4_ = auVar116._8_4_ * auVar116._8_4_;
    auVar78._12_4_ = auVar116._12_4_ * auVar116._12_4_;
    auVar78._16_4_ = auVar116._16_4_ * auVar116._16_4_;
    auVar78._20_4_ = auVar116._20_4_ * auVar116._20_4_;
    auVar78._24_4_ = auVar116._24_4_ * auVar116._24_4_;
    auVar78._28_4_ = auVar116._28_4_;
    auVar89 = vfmadd231ps_fma(auVar78,auVar111,auVar111);
    auVar157 = ZEXT3264(auVar115);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar102,auVar102);
    auVar111 = vmulps_avx512vl(auVar91,auVar91);
    auVar79._4_4_ = fVar57 * fVar57 * auVar111._4_4_;
    auVar79._0_4_ = fVar2 * fVar2 * auVar111._0_4_;
    auVar79._8_4_ = fVar59 * fVar59 * auVar111._8_4_;
    auVar79._12_4_ = fVar61 * fVar61 * auVar111._12_4_;
    auVar79._16_4_ = fVar63 * fVar63 * auVar111._16_4_;
    auVar79._20_4_ = fVar65 * fVar65 * auVar111._20_4_;
    auVar79._24_4_ = fVar67 * fVar67 * auVar111._24_4_;
    auVar79._28_4_ = auVar111._28_4_;
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar142._4_4_ = uVar3;
    auVar142._0_4_ = uVar3;
    auVar142._8_4_ = uVar3;
    auVar142._12_4_ = uVar3;
    auVar142._16_4_ = uVar3;
    auVar142._20_4_ = uVar3;
    auVar142._24_4_ = uVar3;
    auVar142._28_4_ = uVar3;
    bVar74 = (byte)uVar68 & (byte)uVar69 & bVar86;
    auVar111 = vblendmps_avx512vl(auVar148,auVar113);
    auVar117._0_4_ =
         (uint)(bVar74 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar103._0_4_;
    bVar83 = (bool)(bVar74 >> 1 & 1);
    auVar117._4_4_ = (uint)bVar83 * auVar111._4_4_ | (uint)!bVar83 * auVar103._4_4_;
    bVar83 = (bool)(bVar74 >> 2 & 1);
    auVar117._8_4_ = (uint)bVar83 * auVar111._8_4_ | (uint)!bVar83 * auVar103._8_4_;
    bVar83 = (bool)(bVar74 >> 3 & 1);
    auVar117._12_4_ = (uint)bVar83 * auVar111._12_4_ | (uint)!bVar83 * auVar103._12_4_;
    bVar83 = (bool)(bVar74 >> 4 & 1);
    auVar117._16_4_ = (uint)bVar83 * auVar111._16_4_ | (uint)!bVar83 * auVar103._16_4_;
    bVar83 = (bool)(bVar74 >> 5 & 1);
    auVar117._20_4_ = (uint)bVar83 * auVar111._20_4_ | (uint)!bVar83 * auVar103._20_4_;
    bVar83 = (bool)(bVar74 >> 6 & 1);
    auVar117._24_4_ = (uint)bVar83 * auVar111._24_4_ | (uint)!bVar83 * auVar103._24_4_;
    auVar117._28_4_ =
         (uint)(bVar74 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar103._28_4_;
    auVar158 = ZEXT3264(auVar117);
    auVar137._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
    auVar137._8_4_ = auVar96._8_4_ ^ 0x80000000;
    auVar137._12_4_ = auVar96._12_4_ ^ 0x80000000;
    auVar137._16_4_ = auVar96._16_4_ ^ 0x80000000;
    auVar137._20_4_ = auVar96._20_4_ ^ 0x80000000;
    auVar137._24_4_ = auVar96._24_4_ ^ 0x80000000;
    auVar137._28_4_ = auVar96._28_4_ ^ 0x80000000;
    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar89),auVar79,1);
    uVar87 = (bVar86 & ~(byte)line->rightExists) & uVar87;
    auVar95 = vmulps_avx512vl(auVar95,auVar137);
    bVar83 = (bool)((byte)uVar87 & 1);
    auVar118._0_4_ = (uint)bVar83 * auVar95._0_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar118._4_4_ = (uint)bVar83 * auVar95._4_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar118._8_4_ = (uint)bVar83 * auVar95._8_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar118._12_4_ = (uint)bVar83 * auVar95._12_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar118._16_4_ = (uint)bVar83 * auVar95._16_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar118._20_4_ = (uint)bVar83 * auVar95._20_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar118._24_4_ = (uint)bVar83 * auVar95._24_4_ | (uint)!bVar83 * 0x7f800000;
    bVar83 = SUB81(uVar87 >> 7,0);
    auVar118._28_4_ = (uint)bVar83 * auVar95._28_4_ | (uint)!bVar83 * 0x7f800000;
    auVar96 = vminps_avx(auVar115,auVar118);
    auVar95 = vmaxps_avx(auVar115,auVar118);
    auVar111 = vminps_avx512vl(auVar117,auVar96);
    uVar87 = vcmpps_avx512vl(auVar111,auVar96,0);
    uVar72 = vcmpps_avx512vl(auVar95,auVar148,0);
    bVar83 = (bool)((byte)uVar72 & 1);
    bVar19 = (bool)((byte)(uVar72 >> 1) & 1);
    bVar21 = (bool)((byte)(uVar72 >> 2) & 1);
    bVar23 = (bool)((byte)(uVar72 >> 3) & 1);
    bVar25 = (bool)((byte)(uVar72 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar72 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar72 >> 6) & 1);
    bVar49 = SUB81(uVar72 >> 7,0);
    uVar72 = vcmpps_avx512vl(auVar96,auVar148,0);
    bVar84 = (bool)((byte)uVar72 & 1);
    bVar20 = (bool)((byte)(uVar72 >> 1) & 1);
    bVar22 = (bool)((byte)(uVar72 >> 2) & 1);
    bVar24 = (bool)((byte)(uVar72 >> 3) & 1);
    bVar26 = (bool)((byte)(uVar72 >> 4) & 1);
    bVar32 = (bool)((byte)(uVar72 >> 5) & 1);
    bVar40 = (bool)((byte)(uVar72 >> 6) & 1);
    bVar50 = SUB81(uVar72 >> 7,0);
    bVar18 = (bool)((byte)uVar87 & 1);
    auVar119._0_4_ =
         (uint)bVar18 * ((uint)bVar83 * -0x800000 | (uint)!bVar83 * auVar95._0_4_) |
         (uint)!bVar18 * ((uint)bVar84 * -0x800000 | (uint)!bVar84 * auVar96._0_4_);
    bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
    auVar119._4_4_ =
         (uint)bVar83 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar95._4_4_) |
         (uint)!bVar83 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar96._4_4_);
    bVar83 = (bool)((byte)(uVar87 >> 2) & 1);
    auVar119._8_4_ =
         (uint)bVar83 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar95._8_4_) |
         (uint)!bVar83 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar96._8_4_);
    bVar83 = (bool)((byte)(uVar87 >> 3) & 1);
    auVar119._12_4_ =
         (uint)bVar83 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar95._12_4_) |
         (uint)!bVar83 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar96._12_4_);
    bVar83 = (bool)((byte)(uVar87 >> 4) & 1);
    auVar119._16_4_ =
         (uint)bVar83 * ((uint)bVar25 * -0x800000 | (uint)!bVar25 * auVar95._16_4_) |
         (uint)!bVar83 * ((uint)bVar26 * -0x800000 | (uint)!bVar26 * auVar96._16_4_);
    bVar83 = (bool)((byte)(uVar87 >> 5) & 1);
    auVar119._20_4_ =
         (uint)bVar83 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar95._20_4_) |
         (uint)!bVar83 * ((uint)bVar32 * -0x800000 | (uint)!bVar32 * auVar96._20_4_);
    bVar83 = (bool)((byte)(uVar87 >> 6) & 1);
    auVar119._24_4_ =
         (uint)bVar83 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar95._24_4_) |
         (uint)!bVar83 * ((uint)bVar40 * -0x800000 | (uint)!bVar40 * auVar96._24_4_);
    bVar83 = SUB81(uVar87 >> 7,0);
    auVar119._28_4_ =
         (uint)bVar83 * ((uint)bVar49 * -0x800000 | (uint)!bVar49 * auVar95._28_4_) |
         (uint)!bVar83 * ((uint)bVar50 * -0x800000 | (uint)!bVar50 * auVar96._28_4_);
    auVar139._0_4_ = auVar129._0_4_ + auVar111._0_4_;
    auVar139._4_4_ = auVar129._4_4_ + auVar111._4_4_;
    auVar139._8_4_ = auVar129._8_4_ + auVar111._8_4_;
    auVar139._12_4_ = auVar129._12_4_ + auVar111._12_4_;
    auVar139._16_4_ = auVar129._16_4_ + auVar111._16_4_;
    auVar139._20_4_ = auVar129._20_4_ + auVar111._20_4_;
    auVar139._24_4_ = auVar129._24_4_ + auVar111._24_4_;
    auVar139._28_4_ = auVar111._28_4_ + 0.0;
    uVar87 = vcmpps_avx512vl(auVar142,auVar139,2);
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar144._4_4_ = uVar3;
    auVar144._0_4_ = uVar3;
    auVar144._8_4_ = uVar3;
    auVar144._12_4_ = uVar3;
    auVar144._16_4_ = uVar3;
    auVar144._20_4_ = uVar3;
    auVar144._24_4_ = uVar3;
    auVar144._28_4_ = uVar3;
    uVar72 = vcmpps_avx512vl(auVar139,auVar144,2);
    bVar74 = (byte)uVar70 & (byte)uVar71 & bVar86;
    auVar95 = vblendmps_avx512vl(auVar146,auVar114);
    auVar120._0_4_ = (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar112._0_4_
    ;
    bVar83 = (bool)(bVar74 >> 1 & 1);
    auVar120._4_4_ = (uint)bVar83 * auVar95._4_4_ | (uint)!bVar83 * auVar112._4_4_;
    bVar83 = (bool)(bVar74 >> 2 & 1);
    auVar120._8_4_ = (uint)bVar83 * auVar95._8_4_ | (uint)!bVar83 * auVar112._8_4_;
    bVar83 = (bool)(bVar74 >> 3 & 1);
    auVar120._12_4_ = (uint)bVar83 * auVar95._12_4_ | (uint)!bVar83 * auVar112._12_4_;
    bVar83 = (bool)(bVar74 >> 4 & 1);
    auVar120._16_4_ = (uint)bVar83 * auVar95._16_4_ | (uint)!bVar83 * auVar112._16_4_;
    bVar83 = (bool)(bVar74 >> 5 & 1);
    auVar120._20_4_ = (uint)bVar83 * auVar95._20_4_ | (uint)!bVar83 * auVar112._20_4_;
    bVar83 = (bool)(bVar74 >> 6 & 1);
    auVar120._24_4_ = (uint)bVar83 * auVar95._24_4_ | (uint)!bVar83 * auVar112._24_4_;
    auVar120._28_4_ =
         (uint)(bVar74 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar112._28_4_;
    auVar159 = ZEXT3264(auVar120);
    auVar95 = vmaxps_avx512vl(auVar120,auVar119);
    auVar156 = ZEXT3264(auVar95);
    uVar88 = vcmpps_avx512vl(auVar111,auVar148,4);
    uVar88 = uVar87 & uVar72 & uVar88;
    auVar149._0_4_ = auVar95._0_4_ + auVar129._0_4_;
    auVar149._4_4_ = auVar95._4_4_ + auVar129._4_4_;
    auVar149._8_4_ = auVar95._8_4_ + auVar129._8_4_;
    auVar149._12_4_ = auVar95._12_4_ + auVar129._12_4_;
    auVar149._16_4_ = auVar95._16_4_ + auVar129._16_4_;
    auVar149._20_4_ = auVar95._20_4_ + auVar129._20_4_;
    auVar149._24_4_ = auVar95._24_4_ + auVar129._24_4_;
    auVar149._28_4_ = auVar95._28_4_ + 0.0;
    auVar150 = ZEXT3264(auVar149);
    uVar68 = vcmpps_avx512vl(auVar142,auVar149,2);
    uVar69 = vcmpps_avx512vl(auVar149,auVar144,2);
    uVar70 = vcmpps_avx512vl(auVar95,auVar146,4);
    bVar85 = (byte)uVar68 & (byte)uVar69 & (byte)uVar70;
    bVar74 = (byte)uVar88 & bVar86;
    bVar75 = bVar85 & bVar86;
    if (bVar74 != 0 || bVar75 != 0) {
      auVar95 = vblendmps_avx512vl(auVar95,auVar111);
      auVar121._0_4_ =
           (float)((uint)(bVar74 & 1) * auVar95._0_4_ |
                  (uint)!(bool)(bVar74 & 1) * (int)auVar111._0_4_);
      bVar83 = (bool)(bVar74 >> 1 & 1);
      auVar121._4_4_ = (float)((uint)bVar83 * auVar95._4_4_ | (uint)!bVar83 * (int)auVar111._4_4_);
      bVar83 = (bool)(bVar74 >> 2 & 1);
      auVar121._8_4_ = (float)((uint)bVar83 * auVar95._8_4_ | (uint)!bVar83 * (int)auVar111._8_4_);
      bVar83 = (bool)(bVar74 >> 3 & 1);
      auVar121._12_4_ =
           (float)((uint)bVar83 * auVar95._12_4_ | (uint)!bVar83 * (int)auVar111._12_4_);
      bVar83 = (bool)(bVar74 >> 4 & 1);
      auVar121._16_4_ =
           (float)((uint)bVar83 * auVar95._16_4_ | (uint)!bVar83 * (int)auVar111._16_4_);
      bVar83 = (bool)(bVar74 >> 5 & 1);
      auVar121._20_4_ =
           (float)((uint)bVar83 * auVar95._20_4_ | (uint)!bVar83 * (int)auVar111._20_4_);
      bVar83 = (bool)(bVar74 >> 6 & 1);
      auVar121._24_4_ =
           (float)((uint)bVar83 * auVar95._24_4_ | (uint)!bVar83 * (int)auVar111._24_4_);
      auVar121._28_4_ =
           (float)((uint)(bVar74 >> 7) * auVar95._28_4_ |
                  (uint)!(bool)(bVar74 >> 7) * (int)auVar111._28_4_);
      uVar68 = vcmpps_avx512vl(auVar121,auVar117,0);
      uVar69 = vcmpps_avx512vl(auVar121,auVar120,0);
      auVar95 = vblendmps_avx512vl(auVar105,auVar153);
      auVar122._0_4_ =
           (float)((uint)(bVar74 & 1) * auVar95._0_4_ | !(bool)(bVar74 & 1) * auVar119._0_4_);
      bVar83 = (bool)(bVar74 >> 1 & 1);
      auVar122._4_4_ = (float)((uint)bVar83 * auVar95._4_4_ | !bVar83 * auVar119._4_4_);
      bVar83 = (bool)(bVar74 >> 2 & 1);
      auVar122._8_4_ = (float)((uint)bVar83 * auVar95._8_4_ | !bVar83 * auVar119._8_4_);
      bVar83 = (bool)(bVar74 >> 3 & 1);
      auVar122._12_4_ = (float)((uint)bVar83 * auVar95._12_4_ | !bVar83 * auVar119._12_4_);
      bVar83 = (bool)(bVar74 >> 4 & 1);
      auVar122._16_4_ = (float)((uint)bVar83 * auVar95._16_4_ | !bVar83 * auVar119._16_4_);
      bVar83 = (bool)(bVar74 >> 5 & 1);
      auVar122._20_4_ = (float)((uint)bVar83 * auVar95._20_4_ | !bVar83 * auVar119._20_4_);
      bVar83 = (bool)(bVar74 >> 6 & 1);
      auVar122._24_4_ = (float)((uint)bVar83 * auVar95._24_4_ | !bVar83 * auVar119._24_4_);
      auVar122._28_4_ =
           (uint)(bVar74 >> 7) * auVar95._28_4_ | !(bool)(bVar74 >> 7) * auVar119._28_4_;
      auVar80._4_4_ = auVar123._4_4_ * fVar56 * auVar101._4_4_;
      auVar80._0_4_ = auVar123._0_4_ * fVar1 * auVar101._0_4_;
      auVar80._8_4_ = auVar123._8_4_ * fVar58 * auVar101._8_4_;
      auVar80._12_4_ = auVar123._12_4_ * fVar60 * auVar101._12_4_;
      auVar80._16_4_ = auVar123._16_4_ * fVar62 * auVar101._16_4_;
      auVar80._20_4_ = auVar123._20_4_ * fVar64 * auVar101._20_4_;
      auVar80._24_4_ = auVar123._24_4_ * fVar66 * auVar101._24_4_;
      auVar80._28_4_ = auVar123._28_4_;
      auVar95 = vmulps_avx512vl(auVar97,auVar80);
      auVar147 = ZEXT3264(auVar95);
      auVar96 = vmulps_avx512vl(auVar98,auVar80);
      auVar154 = ZEXT3264(auVar96);
      auVar123 = vmulps_avx512vl(auVar99,auVar80);
      auVar160 = ZEXT3264(auVar123);
      local_80 = vmulps_avx512vl(auVar97,auVar132);
      local_a0 = vmulps_avx512vl(auVar98,auVar132);
      auVar105 = vmulps_avx512vl(auVar99,auVar132);
      bVar76 = ((byte)uVar68 | (byte)uVar69) & bVar86;
      uVar87 = vcmpps_avx512vl(auVar121,auVar115,0);
      uVar87 = uVar73 & uVar81 & uVar87;
      auVar111 = vmulps_avx512vl(auVar92,auVar121);
      auVar116 = vmulps_avx512vl(auVar93,auVar121);
      auVar112 = vmulps_avx512vl(auVar94,auVar121);
      auVar126._0_4_ = auVar111._0_4_ + (float)local_5c0._0_4_;
      auVar126._4_4_ = auVar111._4_4_ + (float)local_5c0._4_4_;
      auVar126._8_4_ = auVar111._8_4_ + fStack_5b8;
      auVar126._12_4_ = auVar111._12_4_ + fStack_5b4;
      auVar126._16_4_ = auVar111._16_4_ + fStack_5b0;
      auVar126._20_4_ = auVar111._20_4_ + fStack_5ac;
      auVar126._24_4_ = auVar111._24_4_ + fStack_5a8;
      auVar126._28_4_ = auVar111._28_4_ + local_5c0._28_4_;
      auVar133._0_4_ = auVar116._0_4_ + (float)local_5e0._0_4_;
      auVar133._4_4_ = auVar116._4_4_ + (float)local_5e0._4_4_;
      auVar133._8_4_ = auVar116._8_4_ + fStack_5d8;
      auVar133._12_4_ = auVar116._12_4_ + fStack_5d4;
      auVar133._16_4_ = auVar116._16_4_ + fStack_5d0;
      auVar133._20_4_ = auVar116._20_4_ + fStack_5cc;
      auVar133._24_4_ = auVar116._24_4_ + fStack_5c8;
      auVar133._28_4_ = auVar116._28_4_ + fStack_5c4;
      auVar100 = vaddps_avx512vl(auVar100,auVar112);
      auVar111 = vmulps_avx512vl(auVar107,auVar126);
      auVar116 = vmulps_avx512vl(auVar107,auVar133);
      auVar100 = vmulps_avx512vl(auVar107,auVar100);
      auVar107._0_4_ = auVar95._0_4_ + auVar111._0_4_;
      auVar107._4_4_ = auVar95._4_4_ + auVar111._4_4_;
      auVar107._8_4_ = auVar95._8_4_ + auVar111._8_4_;
      auVar107._12_4_ = auVar95._12_4_ + auVar111._12_4_;
      auVar107._16_4_ = auVar95._16_4_ + auVar111._16_4_;
      auVar107._20_4_ = auVar95._20_4_ + auVar111._20_4_;
      auVar107._24_4_ = auVar95._24_4_ + auVar111._24_4_;
      auVar107._28_4_ = auVar95._28_4_ + auVar111._28_4_;
      auVar134._0_4_ = auVar96._0_4_ + auVar116._0_4_;
      auVar134._4_4_ = auVar96._4_4_ + auVar116._4_4_;
      auVar134._8_4_ = auVar96._8_4_ + auVar116._8_4_;
      auVar134._12_4_ = auVar96._12_4_ + auVar116._12_4_;
      auVar134._16_4_ = auVar96._16_4_ + auVar116._16_4_;
      auVar134._20_4_ = auVar96._20_4_ + auVar116._20_4_;
      auVar134._24_4_ = auVar96._24_4_ + auVar116._24_4_;
      auVar134._28_4_ = auVar96._28_4_ + auVar116._28_4_;
      auVar95 = vaddps_avx512vl(auVar123,auVar100);
      auVar92._4_4_ = local_80._4_4_ * auVar122._4_4_;
      auVar92._0_4_ = local_80._0_4_ * auVar122._0_4_;
      auVar92._8_4_ = local_80._8_4_ * auVar122._8_4_;
      auVar92._12_4_ = local_80._12_4_ * auVar122._12_4_;
      auVar92._16_4_ = local_80._16_4_ * auVar122._16_4_;
      auVar92._20_4_ = local_80._20_4_ * auVar122._20_4_;
      auVar92._24_4_ = local_80._24_4_ * auVar122._24_4_;
      auVar92._28_4_ = local_80._28_4_;
      auVar93._4_4_ = local_a0._4_4_ * auVar122._4_4_;
      auVar93._0_4_ = local_a0._0_4_ * auVar122._0_4_;
      auVar93._8_4_ = local_a0._8_4_ * auVar122._8_4_;
      auVar93._12_4_ = local_a0._12_4_ * auVar122._12_4_;
      auVar93._16_4_ = local_a0._16_4_ * auVar122._16_4_;
      auVar93._20_4_ = local_a0._20_4_ * auVar122._20_4_;
      auVar93._24_4_ = local_a0._24_4_ * auVar122._24_4_;
      auVar93._28_4_ = local_a0._28_4_;
      local_c0 = vxorps_avx512vl(auVar97,auVar135);
      auVar96 = vblendmps_avx512vl(auVar97,local_c0);
      bVar74 = (byte)uVar87;
      bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar20 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar21 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar22 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar23 = SUB81(uVar87 >> 7,0);
      auVar97 = vsubps_avx512vl(auVar107,auVar92);
      local_540._0_4_ =
           (uint)(bVar76 & 1) * auVar97._0_4_ |
           (uint)!(bool)(bVar76 & 1) *
           ((uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * local_c0._0_4_);
      bVar84 = (bool)(bVar76 >> 1 & 1);
      local_540._4_4_ =
           (uint)bVar84 * auVar97._4_4_ |
           (uint)!bVar84 * ((uint)bVar83 * auVar96._4_4_ | (uint)!bVar83 * local_c0._4_4_);
      bVar83 = (bool)(bVar76 >> 2 & 1);
      local_540._8_4_ =
           (uint)bVar83 * auVar97._8_4_ |
           (uint)!bVar83 * ((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * local_c0._8_4_);
      bVar83 = (bool)(bVar76 >> 3 & 1);
      local_540._12_4_ =
           (uint)bVar83 * auVar97._12_4_ |
           (uint)!bVar83 * ((uint)bVar19 * auVar96._12_4_ | (uint)!bVar19 * local_c0._12_4_);
      bVar83 = (bool)(bVar76 >> 4 & 1);
      local_540._16_4_ =
           (uint)bVar83 * auVar97._16_4_ |
           (uint)!bVar83 * ((uint)bVar20 * auVar96._16_4_ | (uint)!bVar20 * local_c0._16_4_);
      bVar83 = (bool)(bVar76 >> 5 & 1);
      local_540._20_4_ =
           (uint)bVar83 * auVar97._20_4_ |
           (uint)!bVar83 * ((uint)bVar21 * auVar96._20_4_ | (uint)!bVar21 * local_c0._20_4_);
      bVar83 = (bool)(bVar76 >> 6 & 1);
      local_540._24_4_ =
           (uint)bVar83 * auVar97._24_4_ |
           (uint)!bVar83 * ((uint)bVar22 * auVar96._24_4_ | (uint)!bVar22 * local_c0._24_4_);
      local_540._28_4_ =
           (uint)(bVar76 >> 7) * auVar97._28_4_ |
           (uint)!(bool)(bVar76 >> 7) *
           ((uint)bVar23 * auVar96._28_4_ | (uint)!bVar23 * local_c0._28_4_);
      auVar140 = ZEXT3264(auVar105);
      auVar96 = vxorps_avx512vl(auVar98,auVar135);
      auVar162 = ZEXT3264(auVar96);
      auVar96 = vblendmps_avx512vl(auVar98,auVar96);
      bVar83 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar20 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar23 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar26 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar39 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar50 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar51 = SUB81(uVar87 >> 7,0);
      auVar97 = vsubps_avx512vl(auVar134,auVar93);
      bVar84 = (bool)(bVar76 >> 1 & 1);
      bVar21 = (bool)(bVar76 >> 2 & 1);
      bVar24 = (bool)(bVar76 >> 3 & 1);
      bVar31 = (bool)(bVar76 >> 4 & 1);
      bVar40 = (bool)(bVar76 >> 5 & 1);
      bVar41 = (bool)(bVar76 >> 6 & 1);
      auVar94._4_4_ = auVar105._4_4_ * auVar122._4_4_;
      auVar94._0_4_ = auVar105._0_4_ * auVar122._0_4_;
      auVar94._8_4_ = auVar105._8_4_ * auVar122._8_4_;
      auVar94._12_4_ = auVar105._12_4_ * auVar122._12_4_;
      auVar94._16_4_ = auVar105._16_4_ * auVar122._16_4_;
      auVar94._20_4_ = auVar105._20_4_ * auVar122._20_4_;
      auVar94._24_4_ = auVar105._24_4_ * auVar122._24_4_;
      auVar94._28_4_ = auVar134._28_4_;
      local_e0 = vxorps_avx512vl(auVar99,auVar135);
      auVar100 = vblendmps_avx512vl(auVar99,local_e0);
      bVar18 = (bool)((byte)(uVar87 >> 1) & 1);
      bVar22 = (bool)((byte)(uVar87 >> 2) & 1);
      bVar25 = (bool)((byte)(uVar87 >> 3) & 1);
      bVar32 = (bool)((byte)(uVar87 >> 4) & 1);
      bVar49 = (bool)((byte)(uVar87 >> 5) & 1);
      bVar42 = (bool)((byte)(uVar87 >> 6) & 1);
      bVar52 = SUB81(uVar87 >> 7,0);
      auVar95 = vsubps_avx512vl(auVar95,auVar94);
      local_500._0_4_ =
           (uint)(bVar76 & 1) * auVar95._0_4_ |
           (uint)!(bool)(bVar76 & 1) *
           ((uint)(bVar74 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar74 & 1) * local_e0._0_4_);
      bVar19 = (bool)(bVar76 >> 1 & 1);
      local_500._4_4_ =
           (uint)bVar19 * auVar95._4_4_ |
           (uint)!bVar19 * ((uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * local_e0._4_4_);
      bVar18 = (bool)(bVar76 >> 2 & 1);
      local_500._8_4_ =
           (uint)bVar18 * auVar95._8_4_ |
           (uint)!bVar18 * ((uint)bVar22 * auVar100._8_4_ | (uint)!bVar22 * local_e0._8_4_);
      bVar18 = (bool)(bVar76 >> 3 & 1);
      local_500._12_4_ =
           (uint)bVar18 * auVar95._12_4_ |
           (uint)!bVar18 * ((uint)bVar25 * auVar100._12_4_ | (uint)!bVar25 * local_e0._12_4_);
      bVar18 = (bool)(bVar76 >> 4 & 1);
      local_500._16_4_ =
           (uint)bVar18 * auVar95._16_4_ |
           (uint)!bVar18 * ((uint)bVar32 * auVar100._16_4_ | (uint)!bVar32 * local_e0._16_4_);
      bVar18 = (bool)(bVar76 >> 5 & 1);
      local_500._20_4_ =
           (uint)bVar18 * auVar95._20_4_ |
           (uint)!bVar18 * ((uint)bVar49 * auVar100._20_4_ | (uint)!bVar49 * local_e0._20_4_);
      bVar18 = (bool)(bVar76 >> 6 & 1);
      local_500._24_4_ =
           (uint)bVar18 * auVar95._24_4_ |
           (uint)!bVar18 * ((uint)bVar42 * auVar100._24_4_ | (uint)!bVar42 * local_e0._24_4_);
      local_500._28_4_ =
           (uint)(bVar76 >> 7) * auVar95._28_4_ |
           (uint)!(bool)(bVar76 >> 7) *
           ((uint)bVar52 * auVar100._28_4_ | (uint)!bVar52 * local_e0._28_4_);
      auVar95 = vrcp14ps_avx512vl(auVar101);
      auVar100 = vfnmadd213ps_avx512vl(auVar95,auVar101,auVar136);
      auVar89 = vfmadd132ps_fma(auVar100,auVar95,auVar95);
      auVar143 = ZEXT1664(auVar89);
      iVar163 = (uint)!(bool)(bVar74 & 1) * 0x3f800000;
      iVar164 = (uint)!(bool)((byte)(uVar87 >> 1) & 1) * 0x3f800000;
      iVar165 = (uint)!(bool)((byte)(uVar87 >> 2) & 1) * 0x3f800000;
      iVar166 = (uint)!(bool)((byte)(uVar87 >> 3) & 1) * 0x3f800000;
      iVar167 = (uint)!(bool)((byte)(uVar87 >> 4) & 1) * 0x3f800000;
      iVar168 = (uint)!(bool)((byte)(uVar87 >> 5) & 1) * 0x3f800000;
      iVar169 = (uint)!(bool)((byte)(uVar87 >> 6) & 1) * 0x3f800000;
      iVar170 = (uint)!SUB81(uVar87 >> 7,0) * 0x3f800000;
      auVar95 = vmulps_avx512vl(auVar122,ZEXT1632(auVar89));
      local_5a0._0_4_ = (uint)(bVar76 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar76 & 1) * iVar163;
      bVar18 = (bool)(bVar76 >> 1 & 1);
      local_5a0._4_4_ = (uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * iVar164;
      bVar18 = (bool)(bVar76 >> 2 & 1);
      local_5a0._8_4_ = (uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * iVar165;
      bVar18 = (bool)(bVar76 >> 3 & 1);
      local_5a0._12_4_ = (uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * iVar166;
      bVar18 = (bool)(bVar76 >> 4 & 1);
      local_5a0._16_4_ = (uint)bVar18 * auVar95._16_4_ | (uint)!bVar18 * iVar167;
      bVar18 = (bool)(bVar76 >> 5 & 1);
      local_5a0._20_4_ = (uint)bVar18 * auVar95._20_4_ | (uint)!bVar18 * iVar168;
      bVar18 = (bool)(bVar76 >> 6 & 1);
      local_5a0._24_4_ = (uint)bVar18 * auVar95._24_4_ | (uint)!bVar18 * iVar169;
      local_5a0._28_4_ = (uint)(bVar76 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar76 >> 7) * iVar170
      ;
      local_560._0_4_ = auVar129._0_4_ + auVar121._0_4_;
      local_560._4_4_ = auVar129._4_4_ + auVar121._4_4_;
      local_560._8_4_ = auVar129._8_4_ + auVar121._8_4_;
      local_560._12_4_ = auVar129._12_4_ + auVar121._12_4_;
      local_560._16_4_ = auVar129._16_4_ + auVar121._16_4_;
      local_560._20_4_ = auVar129._20_4_ + auVar121._20_4_;
      local_560._24_4_ = auVar129._24_4_ + auVar121._24_4_;
      local_560._28_4_ = auVar121._28_4_ + 0.0;
      local_580 = ZEXT1232(ZEXT812(0)) << 0x20;
      local_520[0] = (uint)(bVar76 & 1) * auVar97._0_4_ |
                     (uint)!(bool)(bVar76 & 1) *
                     ((uint)(bVar74 & 1) * auVar96._0_4_ |
                     (uint)!(bool)(bVar74 & 1) * (int)auVar107._0_4_);
      local_520[1] = (uint)bVar84 * auVar97._4_4_ |
                     (uint)!bVar84 *
                     ((uint)bVar83 * auVar96._4_4_ | (uint)!bVar83 * (int)auVar107._4_4_);
      local_520[2] = (uint)bVar21 * auVar97._8_4_ |
                     (uint)!bVar21 *
                     ((uint)bVar20 * auVar96._8_4_ | (uint)!bVar20 * (int)auVar107._8_4_);
      local_520[3] = (uint)bVar24 * auVar97._12_4_ |
                     (uint)!bVar24 *
                     ((uint)bVar23 * auVar96._12_4_ | (uint)!bVar23 * (int)auVar107._12_4_);
      uStack_510 = (uint)bVar31 * auVar97._16_4_ |
                   (uint)!bVar31 *
                   ((uint)bVar26 * auVar96._16_4_ | (uint)!bVar26 * (int)auVar107._16_4_);
      uStack_50c = (uint)bVar40 * auVar97._20_4_ |
                   (uint)!bVar40 *
                   ((uint)bVar39 * auVar96._20_4_ | (uint)!bVar39 * (int)auVar107._20_4_);
      uStack_508 = (uint)bVar41 * auVar97._24_4_ |
                   (uint)!bVar41 *
                   ((uint)bVar50 * auVar96._24_4_ | (uint)!bVar50 * (int)auVar107._24_4_);
      uStack_504 = (uint)(bVar76 >> 7) * auVar97._28_4_ |
                   (uint)!(bool)(bVar76 >> 7) *
                   ((uint)bVar51 * auVar96._28_4_ | (uint)!bVar51 * (int)auVar107._28_4_);
      uVar81 = (ulong)(bVar86 & ((byte)uVar88 | bVar85));
      auVar95 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar138 = ZEXT3264(auVar95);
      auVar95 = vpcmpeqd_avx2(local_540,local_540);
      auVar145 = ZEXT3264(auVar95);
      do {
        local_630.hit = local_200;
        local_630.valid = (int *)local_600;
        uVar73 = 0;
        for (uVar87 = uVar81; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          uVar73 = uVar73 + 1;
        }
        pGVar15 = (pSVar14->geometries).items[*(uint *)(local_220 + uVar73 * 4)].ptr;
        local_630.ray = (RTCRayN *)ray;
        if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar81 = uVar81 ^ 1L << (uVar73 & 0x3f);
          bVar83 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar83 = false;
        }
        else {
          uVar87 = (ulong)(uint)((int)uVar73 * 4);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
          uVar4 = *(undefined4 *)(local_5a0 + uVar87);
          local_1a0._4_4_ = uVar4;
          local_1a0._0_4_ = uVar4;
          local_1a0._8_4_ = uVar4;
          local_1a0._12_4_ = uVar4;
          local_1a0._16_4_ = uVar4;
          local_1a0._20_4_ = uVar4;
          local_1a0._24_4_ = uVar4;
          local_1a0._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_580 + uVar87);
          local_180._4_4_ = uVar4;
          local_180._0_4_ = uVar4;
          local_180._8_4_ = uVar4;
          local_180._12_4_ = uVar4;
          local_180._16_4_ = uVar4;
          local_180._20_4_ = uVar4;
          local_180._24_4_ = uVar4;
          local_180._28_4_ = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar87);
          local_630.context = context->user;
          local_140 = vpbroadcastd_avx512vl();
          uVar4 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar87);
          local_160._4_4_ = uVar4;
          local_160._0_4_ = uVar4;
          local_160._8_4_ = uVar4;
          local_160._12_4_ = uVar4;
          local_160._16_4_ = uVar4;
          local_160._20_4_ = uVar4;
          local_160._24_4_ = uVar4;
          local_160._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_540 + uVar87);
          uVar5 = *(undefined4 *)((long)local_520 + uVar87);
          local_1e0._4_4_ = uVar5;
          local_1e0._0_4_ = uVar5;
          local_1e0._8_4_ = uVar5;
          local_1e0._12_4_ = uVar5;
          local_1e0._16_4_ = uVar5;
          local_1e0._20_4_ = uVar5;
          local_1e0._24_4_ = uVar5;
          local_1e0._28_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_500 + uVar87);
          local_1c0._4_4_ = uVar5;
          local_1c0._0_4_ = uVar5;
          local_1c0._8_4_ = uVar5;
          local_1c0._12_4_ = uVar5;
          local_1c0._16_4_ = uVar5;
          local_1c0._20_4_ = uVar5;
          local_1c0._24_4_ = uVar5;
          local_1c0._28_4_ = uVar5;
          local_200[0] = (RTCHitN)(char)uVar4;
          local_200[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[4] = (RTCHitN)(char)uVar4;
          local_200[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[8] = (RTCHitN)(char)uVar4;
          local_200[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0xc] = (RTCHitN)(char)uVar4;
          local_200[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x10] = (RTCHitN)(char)uVar4;
          local_200[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x14] = (RTCHitN)(char)uVar4;
          local_200[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x18] = (RTCHitN)(char)uVar4;
          local_200[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x1c] = (RTCHitN)(char)uVar4;
          local_200[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          uStack_11c = (local_630.context)->instID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          uStack_fc = (local_630.context)->instPrimID[0];
          local_100 = uStack_fc;
          uStack_f8 = uStack_fc;
          uStack_f4 = uStack_fc;
          uStack_f0 = uStack_fc;
          uStack_ec = uStack_fc;
          uStack_e8 = uStack_fc;
          uStack_e4 = uStack_fc;
          local_600 = auVar138._0_32_;
          local_630.geometryUserPtr = pGVar15->userPtr;
          local_630.N = 8;
          local_240 = auVar171._0_32_;
          local_260 = auVar172._0_32_;
          local_280 = auVar173._0_32_;
          local_2a0 = auVar174._0_32_;
          local_2c0 = auVar175._0_32_;
          local_2e0 = auVar176._0_32_;
          local_300 = auVar177._0_32_;
          local_320 = auVar178._0_32_;
          local_340 = iVar163;
          iStack_33c = iVar164;
          iStack_338 = iVar165;
          iStack_334 = iVar166;
          iStack_330 = iVar167;
          iStack_32c = iVar168;
          iStack_328 = iVar169;
          iStack_324 = iVar170;
          local_360 = auVar161._0_32_;
          local_380 = auVar157._0_32_;
          local_3a0 = auVar150._0_32_;
          local_3c0 = auVar158._0_32_;
          local_3e0 = auVar156._0_32_;
          local_400 = auVar159._0_32_;
          local_420 = auVar147._0_32_;
          local_440 = auVar154._0_32_;
          local_460 = auVar160._0_32_;
          local_480 = auVar140._0_32_;
          local_4a0 = auVar143._0_32_;
          local_4c0 = auVar162._0_32_;
          local_4e0 = local_600;
          uVar87 = uVar88;
          if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar95 = ZEXT1632(auVar145._0_16_);
            (*pGVar15->occlusionFilterN)(&local_630);
            auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
            auVar145 = ZEXT3264(auVar95);
            auVar138 = ZEXT3264(local_4e0);
            auVar162 = ZEXT3264(local_4c0);
            auVar143 = ZEXT3264(local_4a0);
            auVar140 = ZEXT3264(local_480);
            auVar160 = ZEXT3264(local_460);
            auVar154 = ZEXT3264(local_440);
            auVar147 = ZEXT3264(local_420);
            uVar87 = uVar88 & 0xffff;
            auVar159 = ZEXT3264(local_400);
            auVar156 = ZEXT3264(local_3e0);
            auVar158 = ZEXT3264(local_3c0);
            auVar150 = ZEXT3264(local_3a0);
            auVar157 = ZEXT3264(local_380);
            auVar161 = ZEXT3264(local_360);
            auVar178 = ZEXT3264(local_320);
            auVar177 = ZEXT3264(local_300);
            auVar176 = ZEXT3264(local_2e0);
            auVar175 = ZEXT3264(local_2c0);
            auVar174 = ZEXT3264(local_2a0);
            auVar173 = ZEXT3264(local_280);
            auVar172 = ZEXT3264(local_260);
            auVar171 = ZEXT3264(local_240);
          }
          if (local_600 == (undefined1  [32])0x0) {
            bVar83 = true;
          }
          else {
            p_Var17 = context->args->filter;
            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
              auVar95 = ZEXT1632(auVar145._0_16_);
              (*p_Var17)(&local_630);
              auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
              auVar145 = ZEXT3264(auVar95);
              auVar138 = ZEXT3264(local_4e0);
              auVar162 = ZEXT3264(local_4c0);
              auVar143 = ZEXT3264(local_4a0);
              auVar140 = ZEXT3264(local_480);
              auVar160 = ZEXT3264(local_460);
              auVar154 = ZEXT3264(local_440);
              auVar147 = ZEXT3264(local_420);
              uVar87 = uVar88 & 0xffff;
              auVar159 = ZEXT3264(local_400);
              auVar156 = ZEXT3264(local_3e0);
              auVar158 = ZEXT3264(local_3c0);
              auVar150 = ZEXT3264(local_3a0);
              auVar157 = ZEXT3264(local_380);
              auVar161 = ZEXT3264(local_360);
              auVar178 = ZEXT3264(local_320);
              auVar177 = ZEXT3264(local_300);
              auVar176 = ZEXT3264(local_2e0);
              auVar175 = ZEXT3264(local_2c0);
              auVar174 = ZEXT3264(local_2a0);
              auVar173 = ZEXT3264(local_280);
              auVar172 = ZEXT3264(local_260);
              auVar171 = ZEXT3264(local_240);
            }
            uVar72 = vptestmd_avx512vl(local_600,local_600);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar83 = (bool)((byte)uVar72 & 1);
            auVar124._0_4_ =
                 (uint)bVar83 * auVar95._0_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x100);
            bVar83 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar124._4_4_ =
                 (uint)bVar83 * auVar95._4_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x104);
            bVar83 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar124._8_4_ =
                 (uint)bVar83 * auVar95._8_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x108);
            bVar83 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar124._12_4_ =
                 (uint)bVar83 * auVar95._12_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x10c);
            bVar83 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar124._16_4_ =
                 (uint)bVar83 * auVar95._16_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x110);
            bVar83 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar124._20_4_ =
                 (uint)bVar83 * auVar95._20_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x114);
            bVar83 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar124._24_4_ =
                 (uint)bVar83 * auVar95._24_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x118);
            bVar83 = SUB81(uVar72 >> 7,0);
            auVar124._28_4_ =
                 (uint)bVar83 * auVar95._28_4_ | (uint)!bVar83 * *(int *)(local_630.ray + 0x11c);
            *(undefined1 (*) [32])(local_630.ray + 0x100) = auVar124;
            bVar83 = local_600 == (undefined1  [32])0x0;
          }
          uVar88 = uVar87;
          iVar163 = local_340;
          iVar164 = iStack_33c;
          iVar165 = iStack_338;
          iVar166 = iStack_334;
          iVar167 = iStack_330;
          iVar168 = iStack_32c;
          iVar169 = iStack_328;
          iVar170 = iStack_324;
          if (bVar83 != false) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
            uVar81 = uVar81 ^ 1L << (uVar73 & 0x3f);
          }
        }
      } while ((uVar81 != 0) && (bVar83 != false));
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar77._4_4_ = uVar3;
      auVar77._0_4_ = uVar3;
      auVar77._8_4_ = uVar3;
      auVar77._12_4_ = uVar3;
      auVar77._16_4_ = uVar3;
      auVar77._20_4_ = uVar3;
      auVar77._24_4_ = uVar3;
      auVar77._28_4_ = uVar3;
      uVar68 = vcmpps_avx512vl(auVar150._0_32_,auVar77,2);
      bVar86 = (byte)uVar88 & (byte)uVar68;
      if ((bVar86 & bVar75) == 0) {
        return (bool)(bVar83 ^ 1U);
      }
      auVar97 = auVar156._0_32_;
      uVar68 = vcmpps_avx512vl(auVar97,auVar158._0_32_,0);
      uVar69 = vcmpps_avx512vl(auVar97,auVar159._0_32_,0);
      bVar85 = (byte)uVar68 | (byte)uVar69;
      uVar81 = vcmpps_avx512vl(auVar97,auVar157._0_32_,0);
      auVar95 = vmulps_avx512vl(auVar171._0_32_,auVar97);
      auVar96 = vmulps_avx512vl(auVar172._0_32_,auVar97);
      auVar97 = vmulps_avx512vl(auVar173._0_32_,auVar97);
      auVar127._0_4_ = auVar95._0_4_ + (float)local_5c0._0_4_;
      auVar127._4_4_ = auVar95._4_4_ + (float)local_5c0._4_4_;
      auVar127._8_4_ = auVar95._8_4_ + fStack_5b8;
      auVar127._12_4_ = auVar95._12_4_ + fStack_5b4;
      auVar127._16_4_ = auVar95._16_4_ + fStack_5b0;
      auVar127._20_4_ = auVar95._20_4_ + fStack_5ac;
      auVar127._24_4_ = auVar95._24_4_ + fStack_5a8;
      auVar127._28_4_ = auVar95._28_4_ + fStack_5a4;
      auVar130._0_4_ = auVar96._0_4_ + (float)local_5e0._0_4_;
      auVar130._4_4_ = auVar96._4_4_ + (float)local_5e0._4_4_;
      auVar130._8_4_ = auVar96._8_4_ + fStack_5d8;
      auVar130._12_4_ = auVar96._12_4_ + fStack_5d4;
      auVar130._16_4_ = auVar96._16_4_ + fStack_5d0;
      auVar130._20_4_ = auVar96._20_4_ + fStack_5cc;
      auVar130._24_4_ = auVar96._24_4_ + fStack_5c8;
      auVar130._28_4_ = auVar96._28_4_ + fStack_5c4;
      auVar95 = vaddps_avx512vl(auVar177._0_32_,auVar97);
      auVar100 = auVar178._0_32_;
      auVar96 = vmulps_avx512vl(auVar100,auVar127);
      auVar97 = vmulps_avx512vl(auVar100,auVar130);
      auVar95 = vmulps_avx512vl(auVar100,auVar95);
      auVar128._0_4_ = auVar147._0_4_ + auVar96._0_4_;
      auVar128._4_4_ = auVar147._4_4_ + auVar96._4_4_;
      auVar128._8_4_ = auVar147._8_4_ + auVar96._8_4_;
      auVar128._12_4_ = auVar147._12_4_ + auVar96._12_4_;
      auVar128._16_4_ = auVar147._16_4_ + auVar96._16_4_;
      auVar128._20_4_ = auVar147._20_4_ + auVar96._20_4_;
      auVar128._24_4_ = auVar147._24_4_ + auVar96._24_4_;
      auVar128._28_4_ = auVar147._28_4_ + auVar96._28_4_;
      auVar131._0_4_ = auVar154._0_4_ + auVar97._0_4_;
      auVar131._4_4_ = auVar154._4_4_ + auVar97._4_4_;
      auVar131._8_4_ = auVar154._8_4_ + auVar97._8_4_;
      auVar131._12_4_ = auVar154._12_4_ + auVar97._12_4_;
      auVar131._16_4_ = auVar154._16_4_ + auVar97._16_4_;
      auVar131._20_4_ = auVar154._20_4_ + auVar97._20_4_;
      auVar131._24_4_ = auVar154._24_4_ + auVar97._24_4_;
      auVar131._28_4_ = auVar154._28_4_ + auVar97._28_4_;
      auVar95 = vaddps_avx512vl(auVar160._0_32_,auVar95);
      auVar123 = auVar161._0_32_;
      auVar96 = vmulps_avx512vl(auVar123,local_80);
      auVar97 = vmulps_avx512vl(auVar123,local_a0);
      auVar105 = auVar140._0_32_;
      auVar100 = vmulps_avx512vl(auVar105,auVar123);
      bVar74 = (byte)uVar81;
      bVar84 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar23 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar39 = (bool)((byte)(uVar81 >> 3) & 1);
      bVar51 = (bool)((byte)(uVar81 >> 4) & 1);
      bVar33 = (bool)((byte)(uVar81 >> 5) & 1);
      bVar43 = (bool)((byte)(uVar81 >> 6) & 1);
      bVar53 = SUB81(uVar81 >> 7,0);
      bVar18 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar24 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar40 = (bool)((byte)(uVar81 >> 3) & 1);
      bVar52 = (bool)((byte)(uVar81 >> 4) & 1);
      bVar34 = (bool)((byte)(uVar81 >> 5) & 1);
      bVar44 = (bool)((byte)(uVar81 >> 6) & 1);
      bVar54 = SUB81(uVar81 >> 7,0);
      bVar19 = (bool)((byte)(uVar81 >> 1) & 1);
      bVar25 = (bool)((byte)(uVar81 >> 2) & 1);
      bVar49 = (bool)((byte)(uVar81 >> 3) & 1);
      bVar27 = (bool)((byte)(uVar81 >> 4) & 1);
      bVar35 = (bool)((byte)(uVar81 >> 5) & 1);
      bVar45 = (bool)((byte)(uVar81 >> 6) & 1);
      bVar55 = SUB81(uVar81 >> 7,0);
      auVar96 = vsubps_avx512vl(auVar128,auVar96);
      bVar20 = (bool)(bVar85 >> 1 & 1);
      bVar26 = (bool)(bVar85 >> 2 & 1);
      bVar50 = (bool)(bVar85 >> 3 & 1);
      bVar28 = (bool)(bVar85 >> 4 & 1);
      bVar36 = (bool)(bVar85 >> 5 & 1);
      bVar46 = (bool)(bVar85 >> 6 & 1);
      auVar97 = vsubps_avx512vl(auVar131,auVar97);
      bVar21 = (bool)(bVar85 >> 1 & 1);
      bVar31 = (bool)(bVar85 >> 2 & 1);
      bVar41 = (bool)(bVar85 >> 3 & 1);
      bVar29 = (bool)(bVar85 >> 4 & 1);
      bVar37 = (bool)(bVar85 >> 5 & 1);
      bVar47 = (bool)(bVar85 >> 6 & 1);
      auVar123 = vmulps_avx512vl(auVar123,auVar143._0_32_);
      bVar22 = (bool)(bVar85 >> 1 & 1);
      bVar32 = (bool)(bVar85 >> 2 & 1);
      bVar42 = (bool)(bVar85 >> 3 & 1);
      bVar30 = (bool)(bVar85 >> 4 & 1);
      bVar38 = (bool)(bVar85 >> 5 & 1);
      bVar48 = (bool)(bVar85 >> 6 & 1);
      local_5a0._4_4_ = (uint)bVar22 * auVar123._4_4_ | (uint)!bVar22 * iVar164;
      local_5a0._0_4_ = (uint)(bVar85 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar85 & 1) * iVar163;
      local_5a0._8_4_ = (uint)bVar32 * auVar123._8_4_ | (uint)!bVar32 * iVar165;
      local_5a0._12_4_ = (uint)bVar42 * auVar123._12_4_ | (uint)!bVar42 * iVar166;
      local_5a0._16_4_ = (uint)bVar30 * auVar123._16_4_ | (uint)!bVar30 * iVar167;
      local_5a0._20_4_ = (uint)bVar38 * auVar123._20_4_ | (uint)!bVar38 * iVar168;
      local_5a0._24_4_ = (uint)bVar48 * auVar123._24_4_ | (uint)!bVar48 * iVar169;
      local_5a0._28_4_ =
           (uint)(bVar85 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar85 >> 7) * iVar170;
      local_580 = ZEXT432(0) << 0x20;
      local_560 = auVar150._0_32_;
      local_540._4_4_ =
           (uint)bVar20 * auVar96._4_4_ |
           (uint)!bVar20 * ((uint)bVar84 * local_c0._4_4_ | (uint)!bVar84 * auVar176._4_4_);
      local_540._0_4_ =
           (uint)(bVar85 & 1) * auVar96._0_4_ |
           (uint)!(bool)(bVar85 & 1) *
           ((uint)(bVar74 & 1) * local_c0._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar176._0_4_);
      local_540._8_4_ =
           (uint)bVar26 * auVar96._8_4_ |
           (uint)!bVar26 * ((uint)bVar23 * local_c0._8_4_ | (uint)!bVar23 * auVar176._8_4_);
      local_540._12_4_ =
           (uint)bVar50 * auVar96._12_4_ |
           (uint)!bVar50 * ((uint)bVar39 * local_c0._12_4_ | (uint)!bVar39 * auVar176._12_4_);
      local_540._16_4_ =
           (uint)bVar28 * auVar96._16_4_ |
           (uint)!bVar28 * ((uint)bVar51 * local_c0._16_4_ | (uint)!bVar51 * auVar176._16_4_);
      local_540._20_4_ =
           (uint)bVar36 * auVar96._20_4_ |
           (uint)!bVar36 * ((uint)bVar33 * local_c0._20_4_ | (uint)!bVar33 * auVar176._20_4_);
      local_540._24_4_ =
           (uint)bVar46 * auVar96._24_4_ |
           (uint)!bVar46 * ((uint)bVar43 * local_c0._24_4_ | (uint)!bVar43 * auVar176._24_4_);
      local_540._28_4_ =
           (uint)(bVar85 >> 7) * auVar96._28_4_ |
           (uint)!(bool)(bVar85 >> 7) *
           ((uint)bVar53 * local_c0._28_4_ | (uint)!bVar53 * auVar176._28_4_);
      auVar95 = vsubps_avx512vl(auVar95,auVar100);
      bVar84 = (bool)(bVar85 >> 1 & 1);
      bVar20 = (bool)(bVar85 >> 2 & 1);
      bVar22 = (bool)(bVar85 >> 3 & 1);
      bVar23 = (bool)(bVar85 >> 4 & 1);
      bVar26 = (bool)(bVar85 >> 5 & 1);
      bVar32 = (bool)(bVar85 >> 6 & 1);
      local_520[0] = (uint)(bVar85 & 1) * auVar97._0_4_ |
                     (uint)!(bool)(bVar85 & 1) *
                     ((uint)(bVar74 & 1) * auVar162._0_4_ |
                     (uint)!(bool)(bVar74 & 1) * auVar174._0_4_);
      local_520[1] = (uint)bVar21 * auVar97._4_4_ |
                     (uint)!bVar21 *
                     ((uint)bVar18 * auVar162._4_4_ | (uint)!bVar18 * auVar174._4_4_);
      local_520[2] = (uint)bVar31 * auVar97._8_4_ |
                     (uint)!bVar31 *
                     ((uint)bVar24 * auVar162._8_4_ | (uint)!bVar24 * auVar174._8_4_);
      local_520[3] = (uint)bVar41 * auVar97._12_4_ |
                     (uint)!bVar41 *
                     ((uint)bVar40 * auVar162._12_4_ | (uint)!bVar40 * auVar174._12_4_);
      uStack_510 = (uint)bVar29 * auVar97._16_4_ |
                   (uint)!bVar29 *
                   ((uint)bVar52 * auVar162._16_4_ | (uint)!bVar52 * auVar174._16_4_);
      uStack_50c = (uint)bVar37 * auVar97._20_4_ |
                   (uint)!bVar37 *
                   ((uint)bVar34 * auVar162._20_4_ | (uint)!bVar34 * auVar174._20_4_);
      uStack_508 = (uint)bVar47 * auVar97._24_4_ |
                   (uint)!bVar47 *
                   ((uint)bVar44 * auVar162._24_4_ | (uint)!bVar44 * auVar174._24_4_);
      uStack_504 = (uint)(bVar85 >> 7) * auVar97._28_4_ |
                   (uint)!(bool)(bVar85 >> 7) *
                   ((uint)bVar54 * auVar162._28_4_ | (uint)!bVar54 * auVar174._28_4_);
      local_500._4_4_ =
           (uint)bVar84 * auVar95._4_4_ |
           (uint)!bVar84 * ((uint)bVar19 * local_e0._4_4_ | (uint)!bVar19 * auVar175._4_4_);
      local_500._0_4_ =
           (uint)(bVar85 & 1) * auVar95._0_4_ |
           (uint)!(bool)(bVar85 & 1) *
           ((uint)(bVar74 & 1) * local_e0._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar175._0_4_);
      local_500._8_4_ =
           (uint)bVar20 * auVar95._8_4_ |
           (uint)!bVar20 * ((uint)bVar25 * local_e0._8_4_ | (uint)!bVar25 * auVar175._8_4_);
      local_500._12_4_ =
           (uint)bVar22 * auVar95._12_4_ |
           (uint)!bVar22 * ((uint)bVar49 * local_e0._12_4_ | (uint)!bVar49 * auVar175._12_4_);
      local_500._16_4_ =
           (uint)bVar23 * auVar95._16_4_ |
           (uint)!bVar23 * ((uint)bVar27 * local_e0._16_4_ | (uint)!bVar27 * auVar175._16_4_);
      local_500._20_4_ =
           (uint)bVar26 * auVar95._20_4_ |
           (uint)!bVar26 * ((uint)bVar35 * local_e0._20_4_ | (uint)!bVar35 * auVar175._20_4_);
      local_500._24_4_ =
           (uint)bVar32 * auVar95._24_4_ |
           (uint)!bVar32 * ((uint)bVar45 * local_e0._24_4_ | (uint)!bVar45 * auVar175._24_4_);
      local_500._28_4_ =
           (uint)(bVar85 >> 7) * auVar95._28_4_ |
           (uint)!(bool)(bVar85 >> 7) *
           ((uint)bVar55 * local_e0._28_4_ | (uint)!bVar55 * auVar175._28_4_);
      auVar82 = (undefined1  [8])context->scene;
      uVar81 = (ulong)(bVar86 & bVar75);
      auVar95 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar171 = ZEXT3264(auVar95);
      auVar95 = vpcmpeqd_avx2(auVar105,auVar105);
      auVar172 = ZEXT3264(auVar95);
      do {
        local_630.hit = local_200;
        local_630.valid = (int *)local_600;
        uVar73 = 0;
        for (uVar87 = uVar81; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
          uVar73 = uVar73 + 1;
        }
        pGVar15 = (((Scene *)auVar82)->geometries).items[*(uint *)(local_220 + uVar73 * 4)].ptr;
        if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar81 = uVar81 ^ 1L << (uVar73 & 0x3f);
          bVar84 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar84 = false;
        }
        else {
          uVar87 = (ulong)(uint)((int)uVar73 * 4);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x100);
          uVar4 = *(undefined4 *)(local_5a0 + uVar87);
          local_1a0._4_4_ = uVar4;
          local_1a0._0_4_ = uVar4;
          local_1a0._8_4_ = uVar4;
          local_1a0._12_4_ = uVar4;
          local_1a0._16_4_ = uVar4;
          local_1a0._20_4_ = uVar4;
          local_1a0._24_4_ = uVar4;
          local_1a0._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_580 + uVar87);
          local_180._4_4_ = uVar4;
          local_180._0_4_ = uVar4;
          local_180._8_4_ = uVar4;
          local_180._12_4_ = uVar4;
          local_180._16_4_ = uVar4;
          local_180._20_4_ = uVar4;
          local_180._24_4_ = uVar4;
          local_180._28_4_ = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_560 + uVar87);
          local_630.context = context->user;
          local_140 = vpbroadcastd_avx512vl();
          uVar4 = *(undefined4 *)((long)&(line->primIDs).field_0 + uVar87);
          local_160._4_4_ = uVar4;
          local_160._0_4_ = uVar4;
          local_160._8_4_ = uVar4;
          local_160._12_4_ = uVar4;
          local_160._16_4_ = uVar4;
          local_160._20_4_ = uVar4;
          local_160._24_4_ = uVar4;
          local_160._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_540 + uVar87);
          uVar5 = *(undefined4 *)((long)local_520 + uVar87);
          local_1e0._4_4_ = uVar5;
          local_1e0._0_4_ = uVar5;
          local_1e0._8_4_ = uVar5;
          local_1e0._12_4_ = uVar5;
          local_1e0._16_4_ = uVar5;
          local_1e0._20_4_ = uVar5;
          local_1e0._24_4_ = uVar5;
          local_1e0._28_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_500 + uVar87);
          local_1c0._4_4_ = uVar5;
          local_1c0._0_4_ = uVar5;
          local_1c0._8_4_ = uVar5;
          local_1c0._12_4_ = uVar5;
          local_1c0._16_4_ = uVar5;
          local_1c0._20_4_ = uVar5;
          local_1c0._24_4_ = uVar5;
          local_1c0._28_4_ = uVar5;
          local_200[0] = (RTCHitN)(char)uVar4;
          local_200[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[4] = (RTCHitN)(char)uVar4;
          local_200[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[8] = (RTCHitN)(char)uVar4;
          local_200[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0xc] = (RTCHitN)(char)uVar4;
          local_200[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x10] = (RTCHitN)(char)uVar4;
          local_200[0x11] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x12] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x13] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x14] = (RTCHitN)(char)uVar4;
          local_200[0x15] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x16] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x17] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x18] = (RTCHitN)(char)uVar4;
          local_200[0x19] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x1a] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x1b] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          local_200[0x1c] = (RTCHitN)(char)uVar4;
          local_200[0x1d] = (RTCHitN)(char)((uint)uVar4 >> 8);
          local_200[0x1e] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
          local_200[0x1f] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
          uStack_11c = (local_630.context)->instID[0];
          local_120 = uStack_11c;
          uStack_118 = uStack_11c;
          uStack_114 = uStack_11c;
          uStack_110 = uStack_11c;
          uStack_10c = uStack_11c;
          uStack_108 = uStack_11c;
          uStack_104 = uStack_11c;
          uStack_fc = (local_630.context)->instPrimID[0];
          local_100 = uStack_fc;
          uStack_f8 = uStack_fc;
          uStack_f4 = uStack_fc;
          uStack_f0 = uStack_fc;
          uStack_ec = uStack_fc;
          uStack_e8 = uStack_fc;
          uStack_e4 = uStack_fc;
          local_600 = auVar171._0_32_;
          local_630.geometryUserPtr = pGVar15->userPtr;
          local_630.N = 8;
          local_5c0 = auVar82;
          local_630.ray = (RTCRayN *)ray;
          _local_5e0 = local_600;
          if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar95 = ZEXT1632(auVar172._0_16_);
            (*pGVar15->occlusionFilterN)(&local_630);
            auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
            auVar172 = ZEXT3264(auVar95);
            auVar171 = ZEXT3264(_local_5e0);
            auVar82 = local_5c0;
          }
          if (local_600 == (undefined1  [32])0x0) {
            bVar84 = true;
          }
          else {
            p_Var17 = context->args->filter;
            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
              auVar95 = ZEXT1632(auVar172._0_16_);
              (*p_Var17)(&local_630);
              auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
              auVar172 = ZEXT3264(auVar95);
              auVar171 = ZEXT3264(_local_5e0);
              auVar82 = local_5c0;
            }
            uVar87 = vptestmd_avx512vl(local_600,local_600);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar84 = (bool)((byte)uVar87 & 1);
            auVar125._0_4_ =
                 (uint)bVar84 * auVar95._0_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x100);
            bVar84 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar84 * auVar95._4_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x104);
            bVar84 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar84 * auVar95._8_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x108);
            bVar84 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar84 * auVar95._12_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x10c);
            bVar84 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar84 * auVar95._16_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x110);
            bVar84 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar84 * auVar95._20_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x114);
            bVar84 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar84 * auVar95._24_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x118);
            bVar84 = SUB81(uVar87 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar84 * auVar95._28_4_ | (uint)!bVar84 * *(int *)(local_630.ray + 0x11c);
            *(undefined1 (*) [32])(local_630.ray + 0x100) = auVar125;
            bVar84 = local_600 == (undefined1  [32])0x0;
          }
          if (bVar84 != false) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
            uVar81 = uVar81 ^ 1L << (uVar73 & 0x3f);
          }
        }
      } while ((uVar81 != 0) && (bVar84 != false));
      return (bool)(bVar83 ^ 1U | bVar84 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }